

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&> * __thiscall
Catch::ExprLhs<trng::poisson_dist_const&>::operator==
          (ExprLhs<const_trng::poisson_dist_&> *this,poisson_dist *rhs)

{
  StringRef op;
  bool comparisonResult;
  poisson_dist *in_RSI;
  BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&> *in_RDI;
  poisson_dist *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&> *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult =
       compareEqual<trng::poisson_dist,trng::poisson_dist>(in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = (char *)(in_RSI->P).mu_;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_trng::poisson_dist_&,_const_trng::poisson_dist_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }